

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::
allocCallbackFailMultipleObjectsTest<vkt::api::(anonymous_namespace)::GraphicsPipeline>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  ostringstream *poVar1;
  PlatformInterface *pPVar2;
  char *pcVar3;
  bool bVar4;
  ProgramBinary *__s;
  ProgramBinary *pPVar5;
  VkAllocationCallbacks *allocator;
  DeviceInterface *pDVar6;
  VkDevice pVVar7;
  ulong uVar8;
  long *plVar9;
  Parameters *extraout_RDX;
  char **value;
  undefined1 *puVar10;
  ulong uVar11;
  VkResult result;
  vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
  scopedHandles;
  Environment objEnv;
  Resources res;
  DeterministicFailAllocator objAllocator;
  AllocationCallbackRecorder recorder;
  VkResult local_2dc;
  ProgramBinary *local_2d8;
  ProgramBinary *local_2d0;
  size_t local_2c8;
  undefined1 local_2c0 [32];
  Environment local_2a0;
  undefined1 local_268 [16];
  pointer local_258 [13];
  ios_base local_1f0 [264];
  char *local_e8;
  DeterministicFailAllocator local_e0;
  AllocationCallbackRecorder local_90;
  
  __s = (ProgramBinary *)operator_new(0x20);
  local_2d0 = __s + 1;
  local_2dc = VK_NOT_READY;
  poVar1 = (ostringstream *)(local_268 + 8);
  pPVar5 = (ProgramBinary *)&__s->m_binary;
  if (&__s->m_binary < local_2d0) {
    pPVar5 = local_2d0;
  }
  local_2c8 = ((long)&pPVar5->m_format + ~(ulong)__s & 0xfffffffffffffff8) + 8;
  uVar11 = 0;
  local_2d8 = __s;
  while( true ) {
    memset(__s,0xde,local_2c8);
    allocator = ::vk::getSystemAllocator();
    ::vk::DeterministicFailAllocator::DeterministicFailAllocator
              (&local_e0,allocator,MODE_DO_NOT_COUNT,0);
    ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
              (&local_90,&local_e0.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks,0x80
              );
    pPVar2 = context->m_platformInterface;
    pDVar6 = Context::getDeviceInterface(context);
    pVVar7 = Context::getDevice(context);
    local_2a0.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
    local_2a0.programBinaries = context->m_progCollection;
    local_2a0.allocationCallbacks =
         &local_90.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
    local_2a0.maxResourceConsumers = 4;
    local_268._0_8_ = context->m_testCtx->m_log;
    local_2a0.vkp = pPVar2;
    local_2a0.vkd = pDVar6;
    local_2a0.device = pVVar7;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    __s = local_2d8;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Trying to create ",0x11);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," objects with ",0xe);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," allocation",0xb);
    pcVar3 = ",\n\t\t";
    if (uVar11 != 1) {
      pcVar3 = "%s<%s";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,pcVar3 + 4,(ulong)(uVar11 != 1));
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," passing",8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_1f0);
    GraphicsPipeline::Resources::Resources((Resources *)local_268,&local_2a0,extraout_RDX);
    ::vk::DeterministicFailAllocator::reset(&local_e0,MODE_COUNT_AND_FAIL,(deUint32)uVar11);
    GraphicsPipeline::createMultiple
              ((vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
                *)local_2c0,&local_2a0,(Resources *)local_268,(Parameters *)__s,
               (vector<vk::Handle<(vk::HandleType)18>,_std::allocator<vk::Handle<(vk::HandleType)18>_>_>
                *)local_2d0,&local_2dc);
    std::
    vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
    ::~vector((vector<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>_>_>_>
               *)local_2c0);
    GraphicsPipeline::Resources::~Resources((Resources *)local_268);
    if (local_2dc == VK_SUCCESS) {
      local_268._0_8_ = context->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_268 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Construction of all objects succeeded! ",0x27);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_1f0);
      ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_90);
      ::vk::ChainedAllocator::~ChainedAllocator(&local_e0.super_ChainedAllocator);
      operator_delete(__s,0x20);
      if (uVar11 != 0) goto LAB_003fe707;
      local_268._0_8_ = local_258;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_268,"Allocation callbacks not called","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_QUALITY_WARNING;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_268._0_8_,
                 (long)(ProgramFormat *)local_268._0_8_ + local_268._8_8_);
      goto LAB_003fe87b;
    }
    uVar8 = uVar11;
    if (uVar11 < 4) {
      do {
        if (*(long *)(&__s->m_format + uVar8 * 2) != 0) {
          local_268._0_8_ = local_258;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_268,"Some object handles weren\'t set to NULL","");
          __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
          (__return_storage_ptr__->m_description)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->m_description).field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->m_description,local_268._0_8_,
                     (long)(ProgramFormat *)local_268._0_8_ + local_268._8_8_);
          goto LAB_003fe619;
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != 4);
    }
    if (local_2dc != VK_ERROR_OUT_OF_HOST_MEMORY) break;
    bVar4 = ::vk::validateAndLog(context->m_testCtx->m_log,&local_90,0);
    __s = local_2d8;
    if (!bVar4) {
      local_268._0_8_ = local_258;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_268,"Invalid allocation callback","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_268._0_8_,
                 (long)(ProgramFormat *)local_268._0_8_ + local_268._8_8_);
LAB_003fe619:
      local_2c0._16_8_ = local_258[0];
      local_2c0._0_8_ = local_268._0_8_;
      if ((ProgramBinary *)local_268._0_8_ != (ProgramBinary *)local_258) goto LAB_003fe62e;
      goto LAB_003fe636;
    }
    ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_90);
    ::vk::ChainedAllocator::~ChainedAllocator(&local_e0.super_ChainedAllocator);
    uVar11 = uVar11 + 1;
    if (uVar11 == 5) {
      operator_delete(__s,0x20);
LAB_003fe707:
      local_268._0_8_ = local_258;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_268,"Ok","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_268._0_8_,
                 (long)(ProgramFormat *)local_268._0_8_ + local_268._8_8_);
LAB_003fe87b:
      if ((ProgramBinary *)local_268._0_8_ != (ProgramBinary *)local_258) {
        puVar10 = (undefined1 *)((long)&local_258[0]->m_ptr + 1);
        __s = (ProgramBinary *)local_268._0_8_;
LAB_003fe658:
        operator_delete(__s,(ulong)puVar10);
      }
      return __return_storage_ptr__;
    }
  }
  local_e8 = ::vk::getResultName(local_2dc);
  de::toString<char_const*>((string *)local_2c0,(de *)&local_e8,value);
  plVar9 = (long *)std::__cxx11::string::replace((ulong)local_2c0,0,(char *)0x0,0xa9ec08);
  pPVar5 = (ProgramBinary *)(plVar9 + 2);
  if ((ProgramBinary *)*plVar9 == pPVar5) {
    local_258[0] = *(pointer *)pPVar5;
    local_258[1]._0_4_ = *(undefined4 *)(plVar9 + 3);
    local_258[1]._4_4_ = *(undefined4 *)((long)plVar9 + 0x1c);
    local_268._0_8_ = (ProgramBinary *)local_258;
  }
  else {
    local_258[0] = *(pointer *)pPVar5;
    local_268._0_8_ = (ProgramBinary *)*plVar9;
  }
  local_268._8_8_ = plVar9[1];
  *plVar9 = (long)pPVar5;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_268._0_8_,
             (long)&((ProgramBinary *)local_268._0_8_)->m_format + local_268._8_8_);
  if ((ProgramBinary *)local_268._0_8_ != (ProgramBinary *)local_258) {
    operator_delete((void *)local_268._0_8_,(ulong)((long)&local_258[0]->m_ptr + 1));
  }
  if ((ProgramBinary *)local_2c0._0_8_ != (ProgramBinary *)(local_2c0 + 0x10)) {
LAB_003fe62e:
    operator_delete((void *)local_2c0._0_8_,(ulong)((long)&((pointer)local_2c0._16_8_)->m_ptr + 1));
  }
LAB_003fe636:
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&local_90);
  ::vk::ChainedAllocator::~ChainedAllocator(&local_e0.super_ChainedAllocator);
  puVar10 = (undefined1 *)0x20;
  goto LAB_003fe658;
}

Assistant:

tcu::TestStatus allocCallbackFailMultipleObjectsTest (Context& context, typename Object::Parameters params)
{
	typedef SharedPtr<Move<typename Object::Type> >	ObjectTypeSp;

	static const deUint32	numObjects			= 4;
	const bool				expectNullHandles	= isNullHandleOnAllocationFailure<typename Object::Type>(context);
	deUint32				numPassingAllocs	= 0;

	{
		vector<typename Object::Type>	handles	(numObjects);
		VkResult						result	= VK_NOT_READY;

		for (; numPassingAllocs <= numObjects; ++numPassingAllocs)
		{
			ValidateQueryBits::fillBits(handles.begin(), handles.end());	// fill with garbage

			// \note We have to use the same allocator for both resource dependencies and the object under test,
			//       because pooled objects take memory from the pool.
			DeterministicFailAllocator			objAllocator(getSystemAllocator(), DeterministicFailAllocator::MODE_DO_NOT_COUNT, 0);
			AllocationCallbackRecorder			recorder	(objAllocator.getCallbacks(), 128);
			const Environment					objEnv		(context.getPlatformInterface(),
															 context.getDeviceInterface(),
															 context.getDevice(),
															 context.getUniversalQueueFamilyIndex(),
															 context.getBinaryCollection(),
															 recorder.getCallbacks(),
															 numObjects);

			context.getTestContext().getLog()
				<< TestLog::Message
				<< "Trying to create " << numObjects << " objects with " << numPassingAllocs << " allocation" << (numPassingAllocs != 1 ? "s" : "") << " passing"
				<< TestLog::EndMessage;

			{
				const typename Object::Resources res (objEnv, params);

				objAllocator.reset(DeterministicFailAllocator::MODE_COUNT_AND_FAIL, numPassingAllocs);
				const vector<ObjectTypeSp> scopedHandles = Object::createMultiple(objEnv, res, params, &handles, &result);
			}

			if (result == VK_SUCCESS)
			{
				context.getTestContext().getLog() << TestLog::Message << "Construction of all objects succeeded! " << TestLog::EndMessage;
				break;
			}
			else
			{
				if (expectNullHandles)
				{
					for (deUint32 nullNdx = numPassingAllocs; nullNdx < numObjects; ++nullNdx)
					{
						if (handles[nullNdx] != DE_NULL)
							return tcu::TestStatus::fail("Some object handles weren't set to NULL");
					}
				}

				if (result != VK_ERROR_OUT_OF_HOST_MEMORY)
					return tcu::TestStatus::fail("Got invalid error code: " + de::toString(getResultName(result)));

				if (!validateAndLog(context.getTestContext().getLog(), recorder, 0u))
					return tcu::TestStatus::fail("Invalid allocation callback");
			}
		}
	}

	if (numPassingAllocs == 0)
	{
		if (isPooledObject<typename Object::Type>())
			return tcu::TestStatus::pass("Not validated: pooled objects didn't seem to use host memory");
		else
			return tcu::TestStatus(QP_TEST_RESULT_QUALITY_WARNING, "Allocation callbacks not called");
	}
	else
		return tcu::TestStatus::pass("Ok");
}